

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O0

int can_twoweapon(void)

{
  boolean bVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  obj *local_288;
  obj *local_270;
  char *local_250;
  char *local_248;
  char *local_238;
  char local_228 [8];
  char kbuf [256];
  char local_118 [6];
  boolean disallowed_by_race;
  boolean disallowed_by_role;
  char buf [256];
  obj *otmp;
  
  if ((youmonst.data)->mattk[1].aatyp == 0xfe) {
    if ((uwep == (obj *)0x0) || (uswapwep == (obj *)0x0)) {
      if (uwep == (obj *)0x0) {
        local_250 = "";
        if (uswapwep != (obj *)0x0) {
          local_250 = "right ";
        }
      }
      else {
        local_250 = "left ";
      }
      pcVar2 = body_part(6);
      pcVar3 = " is";
      if (uwep == (obj *)0x0 && uswapwep == (obj *)0x0) {
        pcVar3 = "s are";
      }
      pline("Your %s%s%s empty.",local_250,pcVar2,pcVar3);
    }
    else if ((((uwep->oclass == '\x06') && (objects[uwep->otyp].oc_subtyp != '\0')) ||
             (uwep->oclass == '\x02')) &&
            (((uswapwep->oclass == '\x06' && (objects[uswapwep->otyp].oc_subtyp != '\0')) ||
             (uswapwep->oclass == '\x02')))) {
      if ((((uwep->oclass == '\x02') || (uwep->oclass == '\x06')) &&
          ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) != 0)) ||
         (((uswapwep->oclass == '\x02' || (uswapwep->oclass == '\x06')) &&
          ((*(ushort *)&objects[uswapwep->otyp].field_0x11 & 1) != 0)))) {
        if (((uwep->oclass == '\x02') || (uwep->oclass == '\x06')) &&
           ((*(ushort *)&objects[uwep->otyp].field_0x11 & 1) != 0)) {
          local_288 = uwep;
        }
        else {
          local_288 = uswapwep;
        }
        buf._248_8_ = local_288;
        pcVar2 = Yname2(local_288);
        pline("%s isn\'t one-handed.",pcVar2);
      }
      else if (uarms == (obj *)0x0) {
        if (uswapwep->oartifact == '\0') {
          if (((((uarmg == (obj *)0x0) && (u.uprops[8].extrinsic == 0)) &&
               ((youmonst.mintrinsics & 0x80) == 0)) && (uswapwep->otyp == 0x10e)) &&
             ((((long)uswapwep->corpsenm & 0x3ffffffffffffffU) == 0xc ||
              (((long)uswapwep->corpsenm & 0x3ffffffffffffffU) == 0xb)))) {
            pcVar2 = mons_mname(mons + uswapwep->corpsenm);
            pcVar3 = body_part(6);
            pline("You wield the %s corpse with your bare %s.",pcVar2,pcVar3);
            pcVar2 = mons_mname(mons + uswapwep->corpsenm);
            pcVar2 = an(pcVar2);
            sprintf(local_228,"%s corpse",pcVar2);
            bVar1 = delayed_petrify((char *)0x0,local_228);
            if (bVar1 != '\0') {
              pcVar2 = mons_mname(mons + uswapwep->corpsenm);
              pline("You release the %s corpse!",pcVar2);
            }
          }
          else {
            if ((u.uprops[0x29].intrinsic == 0) && ((*(uint *)&uswapwep->field_0x4a & 1) == 0)) {
              return 1;
            }
            if (u.uprops[0x29].intrinsic == 0) {
              *(uint *)&uswapwep->field_0x4a = *(uint *)&uswapwep->field_0x4a & 0xffffffbf | 0x40;
            }
            drop_uswapwep();
          }
        }
        else {
          pcVar2 = Yname2(uswapwep);
          pcVar3 = otense(uswapwep,"resist");
          pline("%s %s being held second to another weapon!",pcVar2,pcVar3);
        }
      }
      else {
        pline("You can\'t use two weapons while wearing a shield.");
      }
    }
    else {
      if (((uwep->oclass == '\x06') && (objects[uwep->otyp].oc_subtyp != '\0')) ||
         (uwep->oclass == '\x02')) {
        local_270 = uswapwep;
      }
      else {
        local_270 = uwep;
      }
      buf._248_8_ = local_270;
      pcVar2 = Yname2(local_270);
      bVar5 = true;
      if (*(int *)(buf._248_8_ + 0x30) < 2) {
        bVar5 = *(char *)(buf._248_8_ + 0x37) == '\x1d';
      }
      pcVar3 = "isn\'t a weapon";
      if (bVar5) {
        pcVar3 = "aren\'t weapons";
      }
      pline("%s %s.",pcVar2,pcVar3);
    }
  }
  else if ((((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->msize != '\0')) {
    if (u.umonnum == u.umonster) {
      bVar5 = u.weapon_skills[0x26].max_skill < '\x02';
      bVar4 = (youmonst.data)->mattk[1].aatyp == 0xfe;
      local_118[0] = '\0';
      if (!bVar5) {
        if (bVar4) {
          local_238 = urace.adj;
        }
        else {
          local_238 = urace.noun;
        }
        strcpy(local_118,local_238);
      }
      if ((bVar5) || (bVar4)) {
        if (!bVar5) {
          strcat(local_118," ");
        }
        if ((flags.female == '\0') || (urole.name.f == (char *)0x0)) {
          local_248 = urole.name.m;
        }
        else {
          local_248 = urole.name.f;
        }
        strcat(local_118,local_248);
      }
      pcVar2 = upstart(local_118);
      pcVar2 = makeplural(pcVar2);
      pline("%s aren\'t able to use two weapons at once.",pcVar2);
    }
    else {
      pline("You can\'t use two weapons in your current form.");
    }
  }
  else {
    pline("Don\'t be ridiculous!");
  }
  return 0;
}

Assistant:

int can_twoweapon(void)
{
	struct obj *otmp;

#define NOT_WEAPON(obj) (!is_weptool(obj) && obj->oclass != WEAPON_CLASS)
	if (!could_twoweap(youmonst.data)) {
		if (cantwield(youmonst.data)) {
		    pline("Don't be ridiculous!");
		} else if (Upolyd) {
		    pline("You can't use two weapons in your current form.");
		} else {
		    char buf[BUFSZ];
		    boolean disallowed_by_role = P_MAX_SKILL(P_TWO_WEAPON_COMBAT) < P_BASIC;
		    boolean disallowed_by_race = youmonst.data->mattk[1].aatyp != AT_WEAP;
		    buf[0] = '\0';
		    if (!disallowed_by_role)
			strcpy(buf, disallowed_by_race ? urace.noun : urace.adj);
		    if (disallowed_by_role || !disallowed_by_race) {
			if (!disallowed_by_role)
			    strcat(buf, " ");
			strcat(buf, (flags.female && urole.name.f) ?
				    urole.name.f : urole.name.m);
		    }
		    pline("%s aren't able to use two weapons at once.",
			  makeplural(upstart(buf)));
		}
	} else if (!uwep || !uswapwep)
		pline("Your %s%s%s empty.", uwep ? "left " : uswapwep ? "right " : "",
			body_part(HAND), (!uwep && !uswapwep) ? "s are" : " is");
	else if (NOT_WEAPON(uwep) || NOT_WEAPON(uswapwep)) {
		otmp = NOT_WEAPON(uwep) ? uwep : uswapwep;
		pline("%s %s.", Yname2(otmp),
		    is_plural(otmp) ? "aren't weapons" : "isn't a weapon");
	} else if (bimanual(uwep) || bimanual(uswapwep)) {
		otmp = bimanual(uwep) ? uwep : uswapwep;
		pline("%s isn't one-handed.", Yname2(otmp));
	} else if (uarms)
		pline("You can't use two weapons while wearing a shield.");
	else if (uswapwep->oartifact)
		pline("%s %s being held second to another weapon!",
			Yname2(uswapwep), otense(uswapwep, "resist"));
	else if (!uarmg && !Stone_resistance && (uswapwep->otyp == CORPSE &&
		    touch_petrifies(&mons[uswapwep->corpsenm]))) {
		char kbuf[BUFSZ];

		pline("You wield the %s corpse with your bare %s.",
		    mons_mname(&mons[uswapwep->corpsenm]), body_part(HAND));
		sprintf(kbuf, "%s corpse", an(mons_mname(&mons[uswapwep->corpsenm])));
		if (delayed_petrify(NULL, kbuf)) {
		    pline("You release the %s corpse!",
			  mons_mname(&mons[uswapwep->corpsenm]));
		}
	} else if (Glib || uswapwep->cursed) {
		if (!Glib)
			uswapwep->bknown = TRUE;
		drop_uswapwep();
	} else
		return TRUE;
	return FALSE;
}